

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.h
# Opt level: O0

void __thiscall
dap::BasicTypeInfo<dap::ExceptionDetails>::construct
          (BasicTypeInfo<dap::ExceptionDetails> *this,void *ptr)

{
  void *ptr_local;
  BasicTypeInfo<dap::ExceptionDetails> *this_local;
  
  memset(ptr,0,0xe8);
  ExceptionDetails::ExceptionDetails((ExceptionDetails *)ptr);
  return;
}

Assistant:

inline void construct(void* ptr) const override { new (ptr) T(); }